

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O1

ostream * operator<<(ostream *stream,Request *req)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Method: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(req->method)._M_dataplus._M_p,(req->method)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Path: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(req->path)._M_dataplus._M_p,(req->path)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Protocol: ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(req->protocol)._M_dataplus._M_p,(req->protocol)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Host: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(req->host)._M_dataplus._M_p,(req->host)._M_string_length);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Request& req) {
    stream << "Method: "   << req.method  << std::endl
           << "Path: "     << req.path << std::endl
           << "Protocol: " << req.protocol << std::endl
           << "Host: "     << req.host;

    return stream;
}